

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbscreen.cpp
# Opt level: O3

void formatRect(QDebug *debug,QRect r)

{
  QTextStream *pQVar1;
  
  QTextStream::operator<<((QTextStream *)debug->stream,(r.x2.m_i.m_i - r.x1.m_i) + 1);
  pQVar1 = (QTextStream *)debug->stream;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
    pQVar1 = (QTextStream *)debug->stream;
  }
  QTextStream::operator<<(pQVar1,'x');
  pQVar1 = (QTextStream *)debug->stream;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
    pQVar1 = (QTextStream *)debug->stream;
  }
  QTextStream::operator<<(pQVar1,(r.y2.m_i.m_i - r.y1.m_i) + 1);
  pQVar1 = (QTextStream *)debug->stream;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
    pQVar1 = (QTextStream *)debug->stream;
  }
  Qt::forcesign(pQVar1);
  QTextStream::operator<<((QTextStream *)debug->stream,r.x1.m_i.m_i);
  pQVar1 = (QTextStream *)debug->stream;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
    pQVar1 = (QTextStream *)debug->stream;
  }
  QTextStream::operator<<(pQVar1,r.y1.m_i.m_i);
  pQVar1 = (QTextStream *)debug->stream;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
    pQVar1 = (QTextStream *)debug->stream;
  }
  Qt::noforcesign(pQVar1);
  return;
}

Assistant:

static inline void formatRect(QDebug &debug, const QRect r)
{
    debug << r.width() << 'x' << r.height()
        << Qt::forcesign << r.x() << r.y() << Qt::noforcesign;
}